

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

void __thiscall icu_63::CalendarAstronomer::CalendarAstronomer(CalendarAstronomer *this,UDate d)

{
  double dVar1;
  
  this->fTime = d;
  this->fLongitude = 0.0;
  this->fLatitude = 0.0;
  this->fGmtOffset = 0.0;
  (this->moonPosition).ascension = 0.0;
  (this->moonPosition).declination = 0.0;
  this->moonPositionSet = '\0';
  dVar1 = uprv_getNaN_63();
  this->julianDay = dVar1;
  this->julianCentury = dVar1;
  this->sunLongitude = dVar1;
  this->meanAnomalySun = dVar1;
  this->moonLongitude = dVar1;
  this->moonEclipLong = dVar1;
  this->meanAnomalyMoon = dVar1;
  this->eclipObliquity = dVar1;
  this->siderealTime = dVar1;
  this->siderealT0 = dVar1;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

CalendarAstronomer::CalendarAstronomer(UDate d): fTime(d), fLongitude(0.0), fLatitude(0.0), fGmtOffset(0.0), moonPosition(0,0), moonPositionSet(FALSE) {
  clearCache();
}